

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O3

BigNumber * __thiscall
BigNumber::m_square_and_multiply
          (BigNumber *__return_storage_ptr__,BigNumber *this,BigNumber *e,BigNumber *N,int r,
          BigNumber *v,BigNumber *real_r2)

{
  void *pvVar1;
  BigNumber *pBVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  pointer puVar7;
  uint val;
  uint uVar8;
  bool bVar9;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  BigNumber m1;
  BigNumber unite;
  allocator_type local_169;
  BigNumber *local_168;
  int local_15c;
  BigNumber *local_158;
  BigNumber local_150;
  ulong local_130;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_128;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_110;
  BigNumber local_f8;
  BigNumber local_d8;
  BigNumber local_b8;
  BigNumber local_98;
  BigNumber local_78;
  byte abStack_58 [40];
  
  local_98.super_Polynome.m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 1;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_98;
  local_168 = v;
  local_158 = e;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_110,__l,(allocator_type *)&local_150);
  BigNumber(__return_storage_ptr__,&local_110,this->m_base);
  if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_150.super_Polynome.m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 1;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_150;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_128,__l_00,&local_169);
  BigNumber(&local_98,&local_128,this->m_base);
  if (local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  montgomery(&local_150,this,real_r2,N,r,local_168);
  uVar4 = (ulong)((long)(local_158->super_Polynome).m_coef.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(local_158->super_Polynome).m_coef.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2 & 0xffffffff;
  if (uVar4 != 0) {
    bVar9 = true;
    local_15c = r;
    do {
      uVar8 = (local_158->super_Polynome).m_coef.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4 + 0xffffffffffffffff];
      exp2(31.0);
      r = local_15c;
      local_130 = uVar4 - 1;
      uVar3 = 0x80000000;
      lVar5 = 0;
      do {
        uVar6 = uVar3;
        if (uVar8 < uVar3) {
          uVar6 = 0;
        }
        abStack_58[lVar5] = uVar8 < uVar3 ^ 0x31;
        uVar8 = uVar8 - uVar6;
        uVar3 = uVar3 >> 1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x20);
      lVar5 = 0;
      do {
        if (bVar9) {
          bVar9 = true;
          if (abStack_58[lVar5] == 0x31) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b8,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_150);
            local_b8.m_base = local_150.m_base;
            __return_storage_ptr__->m_base = local_150.m_base;
            puVar7 = (__return_storage_ptr__->super_Polynome).m_coef.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((__return_storage_ptr__->super_Polynome).m_coef.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish != puVar7) {
              (__return_storage_ptr__->super_Polynome).m_coef.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = puVar7;
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr__
                       ,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b8);
            pBVar2 = &local_b8;
            puVar7 = local_b8.super_Polynome.m_coef.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
LAB_00102a98:
            if (puVar7 != (pointer)0x0) {
              operator_delete(puVar7,(long)*(pointer *)
                                            ((long)&(pBVar2->super_Polynome).m_coef.
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl + 0x10) - (long)puVar7);
            }
            goto LAB_00102aa8;
          }
        }
        else {
          montgomery(&local_78,__return_storage_ptr__,__return_storage_ptr__,N,r,local_168);
          __return_storage_ptr__->m_base = local_78.m_base;
          puVar7 = (__return_storage_ptr__->super_Polynome).m_coef.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((__return_storage_ptr__->super_Polynome).m_coef.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish != puVar7) {
            (__return_storage_ptr__->super_Polynome).m_coef.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = puVar7;
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr__,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
          if (local_78.super_Polynome.m_coef.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_78.super_Polynome.m_coef.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_78.super_Polynome.m_coef.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_78.super_Polynome.m_coef.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (abStack_58[lVar5] == 0x31) {
            montgomery(&local_d8,__return_storage_ptr__,&local_150,N,r,local_168);
            __return_storage_ptr__->m_base = local_d8.m_base;
            puVar7 = (__return_storage_ptr__->super_Polynome).m_coef.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((__return_storage_ptr__->super_Polynome).m_coef.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish != puVar7) {
              (__return_storage_ptr__->super_Polynome).m_coef.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = puVar7;
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr__
                       ,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d8);
            pBVar2 = &local_d8;
            puVar7 = local_d8.super_Polynome.m_coef.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            goto LAB_00102a98;
          }
LAB_00102aa8:
          bVar9 = false;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x20);
      uVar4 = local_130;
    } while (local_130 != 0);
  }
  montgomery(&local_f8,__return_storage_ptr__,&local_98,N,r,local_168);
  __return_storage_ptr__->m_base = local_f8.m_base;
  puVar7 = (__return_storage_ptr__->super_Polynome).m_coef.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((__return_storage_ptr__->super_Polynome).m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar7) {
    (__return_storage_ptr__->super_Polynome).m_coef.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar7;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr__,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f8);
  if (local_f8.super_Polynome.m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar1 = (void *)CONCAT44(local_150.super_Polynome.m_coef.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_150.super_Polynome.m_coef.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_150.super_Polynome.m_coef.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  pvVar1 = (void *)CONCAT44(local_98.super_Polynome.m_coef.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_98.super_Polynome.m_coef.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_98.super_Polynome.m_coef.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

BigNumber BigNumber::m_square_and_multiply(BigNumber &e, BigNumber &N, const int r, BigNumber &v, BigNumber &real_r2){

    unsigned int size = 32;
    char representation[(unsigned long)size];
    BigNumber result ({1}, m_base);
    BigNumber unite ({1}, m_base);
    BigNumber m1 = montgomery(*this, real_r2, N, r, v);
    bool empty = true;

    for(unsigned long i = e.m_degre() ; i > 0; i--){
        representation_binaire(e.m_coef[i - 1], representation, size);
        for(unsigned int j = 0; j < size; j++) {
            //cout << i << "  " << j << "   " << e.m_degre() << endl;
            if(!empty) {
                result = montgomery(result, result, N, r, v);
            }
            if (representation[j] == '1') {
                if(empty){
                    result = m1;
                    empty = false;
                }
                else {
                    result = montgomery(result, m1, N, r, v);
                }
            }
        }

    }
    result = montgomery(result, unite, N, r, v);
    return result;
}